

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3StrHash(void *pKey,int nKey)

{
  size_t sVar1;
  uint local_24;
  char *pcStack_20;
  uint h;
  char *z;
  int nKey_local;
  void *pKey_local;
  
  local_24 = 0;
  pcStack_20 = (char *)pKey;
  z._4_4_ = nKey;
  if (nKey < 1) {
    sVar1 = strlen((char *)pKey);
    z._4_4_ = (int)sVar1;
  }
  for (; 0 < z._4_4_; z._4_4_ = z._4_4_ + -1) {
    local_24 = local_24 << 3 ^ local_24 ^ (int)*pcStack_20;
    pcStack_20 = pcStack_20 + 1;
  }
  return local_24 & 0x7fffffff;
}

Assistant:

static int fts3StrHash(const void *pKey, int nKey){
  const char *z = (const char *)pKey;
  unsigned h = 0;
  if( nKey<=0 ) nKey = (int) strlen(z);
  while( nKey > 0  ){
    h = (h<<3) ^ h ^ *z++;
    nKey--;
  }
  return (int)(h & 0x7fffffff);
}